

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_ffi_istype(jit_State *J,RecordFFData *rd)

{
  uint tr;
  
  argv2ctype(J,*J->base,rd->argv);
  tr = J->base[1];
  if ((tr & 0x1f000000) == 0xa000000) {
    argv2ctype(J,tr,rd->argv + 1);
    J->postproc = LJ_POST_FIXBOOL;
    *J->base = 0x2007ffd;
  }
  else {
    *J->base = 0x1007ffe;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_istype(jit_State *J, RecordFFData *rd)
{
  argv2ctype(J, J->base[0], &rd->argv[0]);
  if (tref_iscdata(J->base[1])) {
    argv2ctype(J, J->base[1], &rd->argv[1]);
    J->postproc = LJ_POST_FIXBOOL;
    J->base[0] = TREF_TRUE;
  } else {
    J->base[0] = TREF_FALSE;
  }
}